

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::SetGlider(Board *this,int fromTopEdge,int fromLeftEdge)

{
  initializer_list<Cord> __l;
  allocator_type local_61;
  vector<Cord,_std::allocator<Cord>_> glider;
  Cord local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  GenerateEmptyBoard(this);
  local_48.x = 0;
  local_48.y = 1;
  uStack_40 = 0x200000001;
  local_38 = 2;
  uStack_30 = 0x100000002;
  local_28 = 0x200000002;
  __l._M_len = 5;
  __l._M_array = &local_48;
  std::vector<Cord,_std::allocator<Cord>_>::vector(&glider,__l,&local_61);
  PopulateBoard(this,&glider,fromTopEdge,fromLeftEdge);
  std::_Vector_base<Cord,_std::allocator<Cord>_>::~_Vector_base
            (&glider.super__Vector_base<Cord,_std::allocator<Cord>_>);
  return;
}

Assistant:

void Board::SetGlider(int fromTopEdge, int fromLeftEdge)
{
    GenerateEmptyBoard();
    
    const std::vector<Cord> glider {Cord(0, 1), Cord(1, 2), Cord(2, 0), Cord(2, 1), Cord(2, 2)};

    PopulateBoard(glider, fromTopEdge, fromLeftEdge);
}